

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

CookieInfo * Curl_cookie_init(Curl_easy *data,char *file,CookieInfo *inc,_Bool newsession)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  CookieInfo *c;
  
  c = inc;
  if (inc == (CookieInfo *)0x0) {
    c = (CookieInfo *)(*Curl_ccalloc)(1,0x820);
    if (c != (CookieInfo *)0x0) {
      pcVar4 = "none";
      if (file != (char *)0x0) {
        pcVar4 = file;
      }
      pcVar4 = (*Curl_cstrdup)(pcVar4);
      c->filename = pcVar4;
      if (pcVar4 != (char *)0x0) {
        c->next_expiration = 0x7fffffffffffffff;
        goto LAB_004aeb08;
      }
      bVar2 = true;
      __stream = (FILE *)0x0;
LAB_004aec99:
      (*Curl_cfree)((void *)0x0);
      if (inc == (CookieInfo *)0x0) {
        Curl_cookie_cleanup(c);
      }
      if (__stream != (FILE *)0x0 && bVar2) {
        fclose(__stream);
      }
    }
    c = (CookieInfo *)0x0;
  }
  else {
LAB_004aeb08:
    c->running = false;
    __stream = _stdin;
    if ((file == (char *)0x0) || (*file == '\0')) {
LAB_004aec76:
      c->newsession = newsession;
    }
    else {
      if ((*file == '-') && (file[1] == '\0')) {
        c->newsession = newsession;
        if (__stream == (FILE *)0x0) goto LAB_004aec7d;
        bVar2 = false;
      }
      else {
        __stream = fopen64(file,"r");
        if (__stream == (FILE *)0x0) {
          Curl_infof(data,"WARNING: failed to open cookie file \"%s\"",file);
          goto LAB_004aec76;
        }
        c->newsession = newsession;
        bVar2 = true;
      }
      pcVar4 = (char *)(*Curl_cmalloc)(5000);
      if (pcVar4 == (char *)0x0) goto LAB_004aec99;
      while( true ) {
        pcVar5 = Curl_get_line(pcVar4,5000,(FILE *)__stream);
        if (pcVar5 == (char *)0x0) break;
        iVar3 = curl_strnequal(pcVar4,"Set-Cookie:",0xb);
        pcVar5 = pcVar4;
        if (iVar3 != 0) {
          pcVar5 = pcVar4 + 0xb;
        }
        for (; (*pcVar5 == ' ' || (*pcVar5 == '\t')); pcVar5 = pcVar5 + 1) {
        }
        Curl_cookie_add(data,c,iVar3 != 0,true,pcVar5,(char *)0x0,(char *)0x0,true);
      }
      (*Curl_cfree)(pcVar4);
      remove_expired(c);
      if (bVar2) {
        fclose(__stream);
      }
    }
LAB_004aec7d:
    c->running = true;
    if (data != (Curl_easy *)0x0) {
      puVar1 = &(data->state).field_0x6d1;
      *puVar1 = *puVar1 | 0x40;
    }
  }
  return c;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct Curl_easy *data,
                                    const char *file,
                                    struct CookieInfo *inc,
                                    bool newsession)
{
  struct CookieInfo *c;
  FILE *fp = NULL;
  bool fromfile = TRUE;
  char *line = NULL;

  if(!inc) {
    /* we didn't get a struct, create one */
    c = calloc(1, sizeof(struct CookieInfo));
    if(!c)
      return NULL; /* failed to get memory */
    c->filename = strdup(file?file:"none"); /* copy the name just in case */
    if(!c->filename)
      goto fail; /* failed to get memory */
    /*
     * Initialize the next_expiration time to signal that we don't have enough
     * information yet.
     */
    c->next_expiration = CURL_OFF_T_MAX;
  }
  else {
    /* we got an already existing one, use that */
    c = inc;
  }
  c->running = FALSE; /* this is not running, this is init */

  if(file && !strcmp(file, "-")) {
    fp = stdin;
    fromfile = FALSE;
  }
  else if(!file || !*file) {
    /* points to an empty string or NULL */
    fp = NULL;
  }
  else {
    fp = fopen(file, FOPEN_READTEXT);
    if(!fp)
      infof(data, "WARNING: failed to open cookie file \"%s\"", file);
  }

  c->newsession = newsession; /* new session? */

  if(fp) {
    char *lineptr;
    bool headerline;

    line = malloc(MAX_COOKIE_LINE);
    if(!line)
      goto fail;
    while(Curl_get_line(line, MAX_COOKIE_LINE, fp)) {
      if(checkprefix("Set-Cookie:", line)) {
        /* This is a cookie line, get it! */
        lineptr = &line[11];
        headerline = TRUE;
      }
      else {
        lineptr = line;
        headerline = FALSE;
      }
      while(*lineptr && ISBLANK(*lineptr))
        lineptr++;

      Curl_cookie_add(data, c, headerline, TRUE, lineptr, NULL, NULL, TRUE);
    }
    free(line); /* free the line buffer */

    /*
     * Remove expired cookies from the hash. We must make sure to run this
     * after reading the file, and not on every cookie.
     */
    remove_expired(c);

    if(fromfile && fp)
      fclose(fp);
  }

  c->running = TRUE;          /* now, we're running */
  if(data)
    data->state.cookie_engine = TRUE;

  return c;

fail:
  free(line);
  /*
   * Only clean up if we allocated it here, as the original could still be in
   * use by a share handle.
   */
  if(!inc)
    Curl_cookie_cleanup(c);
  if(fromfile && fp)
    fclose(fp);
  return NULL; /* out of memory */
}